

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtRuntime.cpp
# Opt level: O0

void __thiscall JsrtRuntime::EnsureJsrtDebugManager(JsrtRuntime *this)

{
  code *pcVar1;
  bool bVar2;
  HeapAllocator *alloc;
  JsrtDebugManager *this_00;
  undefined4 *puVar3;
  TrackAllocData local_38;
  JsrtRuntime *local_10;
  JsrtRuntime *this_local;
  
  local_10 = this;
  if (this->jsrtDebugManager == (JsrtDebugManager *)0x0) {
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_38,(type_info *)&JsrtDebugManager::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtRuntime.cpp"
               ,0xc4);
    alloc = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_38);
    this_00 = (JsrtDebugManager *)new<Memory::HeapAllocator>(0x68,alloc,0x350bd0);
    JsrtDebugManager::JsrtDebugManager(this_00,this->threadContext);
    this->jsrtDebugManager = this_00;
  }
  if (this->jsrtDebugManager == (JsrtDebugManager *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtRuntime.cpp"
                       ,0xc6,"(this->jsrtDebugManager != nullptr)",
                       "this->jsrtDebugManager != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  return;
}

Assistant:

void JsrtRuntime::EnsureJsrtDebugManager()
{
    if (this->jsrtDebugManager == nullptr)
    {
        this->jsrtDebugManager = HeapNew(JsrtDebugManager, this->threadContext);
    }
    Assert(this->jsrtDebugManager != nullptr);
}